

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

void __thiscall
pbrt::ZSobolSampler::StartPixelSample(ZSobolSampler *this,Point2i *p,int index,int dim)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  this->dimension = dim;
  bVar1 = (byte)this->log2SamplesPerPixel;
  uVar2 = (ulong)(uint)(p->super_Tuple2<pbrt::Point2,_int>).x;
  uVar3 = (ulong)(uint)(p->super_Tuple2<pbrt::Point2,_int>).y;
  uVar3 = (uVar3 << 0x10 | uVar3) & 0xffff0000ffff;
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff00ff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f0f0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x3333333333333333;
  uVar2 = (uVar2 << 0x10 | uVar2) & 0xffff0000ffff;
  uVar2 = (uVar2 << 8 | uVar2) & 0xff00ff00ff00ff;
  uVar2 = (uVar2 << 4 | uVar2) & 0xf0f0f0f0f0f0f0f;
  uVar2 = (uVar2 * 4 | uVar2) & 0x3333333333333333;
  this->mortonIndex =
       (long)(index << (bVar1 & 1)) |
       ((uVar2 * 2 | uVar2) & 0x5555555555555555 | (uVar3 * 2 | uVar3 * 4) & 0xaaaaaaaaaaaaaaaa) <<
       ((ulong)(bVar1 + 1 & 0xfe) & 0x3f);
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int index, int dim) {
        dimension = dim;
        bool pow2Samples = log2SamplesPerPixel & 1;
        if (pow2Samples)
            index <<= 1;
        mortonIndex =
            (EncodeMorton2(p.x, p.y) << ((log2SamplesPerPixel + 1) & ~1)) | index;
    }